

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack4_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  
  auVar2 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  uVar1 = *in;
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar19._8_8_ = 0x1800000014;
  auVar19._0_8_ = 0x1800000014;
  auVar7 = vpmovsxbd_avx512f(_DAT_0018acf0);
  auVar8 = vpmovsxbd_avx512f(_DAT_001a3e20);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(0xf));
  auVar10 = vbroadcasti64x4_avx512f(_DAT_001a4ee0);
  auVar11 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar15,auVar2);
  auVar3 = vpshufd_avx(auVar19,0x50);
  auVar5 = vpsrlvd_avx2(auVar11._0_16_,auVar2);
  auVar16 = vpsrlvd_avx2(auVar11._0_16_,auVar19);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar15),1);
  auVar4 = vpsrlvd_avx2(auVar15,auVar3);
  auVar17._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar2;
  auVar17._16_16_ = ZEXT116(1) * auVar4;
  auVar6 = vpblendd_avx2(auVar6,auVar17,0x60);
  auVar11 = vpbroadcastd_avx512f();
  auVar11 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar11._32_4_,auVar6)),auVar7,ZEXT1664(auVar5));
  auVar11 = vpermt2d_avx512f(auVar11,auVar8,ZEXT1664(auVar16));
  auVar12 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar12._0_16_,auVar19);
  auVar13 = valignd_avx512f(auVar11,auVar11,9);
  auVar11 = vpandd_avx512f(auVar11,auVar9);
  auVar13 = vpsrlvd_avx512f(auVar13,auVar10);
  auVar14._0_28_ = auVar11._0_28_;
  auVar14._28_4_ = auVar13._28_4_;
  auVar14._32_4_ = auVar11._32_4_;
  auVar14._36_4_ = auVar11._36_4_;
  auVar14._40_4_ = auVar11._40_4_;
  auVar14._44_4_ = auVar11._44_4_;
  auVar14._48_4_ = auVar11._48_4_;
  auVar14._52_4_ = auVar11._52_4_;
  auVar14._60_4_ = auVar13._60_4_;
  auVar14._56_4_ = auVar11._56_4_;
  auVar11 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])out = auVar11;
  uVar1 = in[2];
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar5 = vpsrlvd_avx2(auVar16,auVar2);
  auVar2 = vpsrlvd_avx2(auVar12._0_16_,auVar2);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar5),ZEXT1632(auVar5),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar16),1);
  auVar3 = vpsrlvd_avx2(auVar16,auVar3);
  auVar18._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar18._16_16_ = ZEXT116(1) * auVar3;
  auVar6 = vpblendd_avx2(auVar6,auVar18,0x60);
  auVar11 = vpbroadcastd_avx512f();
  auVar11 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar11._32_4_,auVar6)),auVar7,ZEXT1664(auVar2));
  auVar11 = vpermt2d_avx512f(auVar11,auVar8,ZEXT1664(auVar4));
  auVar7 = valignd_avx512f(auVar11,auVar11,9);
  auVar11 = vpandd_avx512f(auVar11,auVar9);
  auVar7 = vpsrlvd_avx512f(auVar7,auVar10);
  auVar8._0_28_ = auVar11._0_28_;
  auVar8._28_4_ = auVar7._28_4_;
  auVar8._32_4_ = auVar11._32_4_;
  auVar8._36_4_ = auVar11._36_4_;
  auVar8._40_4_ = auVar11._40_4_;
  auVar8._44_4_ = auVar11._44_4_;
  auVar8._48_4_ = auVar11._48_4_;
  auVar8._52_4_ = auVar11._52_4_;
  auVar8._60_4_ = auVar7._60_4_;
  auVar8._56_4_ = auVar11._56_4_;
  auVar11 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])(out + 0x10) = auVar11;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack4_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}